

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O1

size_t object_desc(char *buf,size_t max,object *obj,uint32_t mode,player *p)

{
  short sVar1;
  player *p_00;
  _Bool _Var2;
  _Bool _Var3;
  char cVar4;
  bool bVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  size_t sVar8;
  object_kind *poVar9;
  object *poVar10;
  object *poVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  player *ppVar16;
  byte bVar17;
  int16_t iVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  char *pcVar22;
  ulong uVar23;
  bool bVar24;
  size_t local_98;
  undefined8 local_90;
  object *local_88;
  player *local_80;
  size_t local_78 [8];
  undefined4 local_38;
  
  if ((obj == (object *)0x0) || (obj->known == (object *)0x0)) {
    pcVar15 = "(nothing)";
LAB_00189dda:
    sVar8 = strnfmt(buf,max,pcVar15);
    return sVar8;
  }
  if (obj->kind != obj->known->kind) {
    if ((mode & 0x40) == 0) {
      pcVar15 = "unknown item";
    }
    else {
      pcVar15 = "an unknown item";
    }
    goto LAB_00189dda;
  }
  _Var2 = tval_is_money(obj);
  if (_Var2) {
    sVar1 = obj->pval;
    pcVar15 = obj->kind->name;
    _Var2 = ignore_item_ok(p,obj);
    pcVar22 = "";
    if (_Var2) {
      pcVar22 = " {ignore}";
    }
    sVar8 = strnfmt(buf,max,"%d gold pieces worth of %s%s",(ulong)(uint)(int)sVar1,pcVar15,pcVar22);
    return sVar8;
  }
  if (((mode & 0x20) == 0) && (obj->known->ego != (ego_item *)0x0)) {
    obj->ego->everseen = true;
  }
  _Var2 = object_flavor_is_aware(obj);
  if (((mode & 0x20) == 0) && (_Var2)) {
    obj->kind->everseen = true;
  }
  local_98 = 0;
  if ((mode >> 10 & 1) == 0) {
    uVar19 = (uint)obj->number;
  }
  else {
    uVar19 = mode >> 0x10;
  }
  local_80 = p;
  _Var2 = object_flavor_is_aware(obj);
  if (((mode & 0x10) == 0) && (obj->artifact == (artifact *)0x0)) {
    local_90 = (char *)CONCAT44(local_90._4_4_,
                                CONCAT31((int3)(uVar19 >> 8),(mode & 8) != 0 || uVar19 != 1));
  }
  else {
    local_90 = (char *)((ulong)local_90._4_4_ << 0x20);
  }
  local_88 = obj;
  if (obj->known == (object *)0x0) {
    bVar24 = false;
  }
  else {
    _Var3 = flag_has_dbg(obj->known->flags,6,0x2a,"obj->known->flags","OF_PERFECT_BALANCE");
    if (_Var3) {
      bVar24 = local_88->artifact == (artifact *)0x0;
    }
    else {
      bVar24 = false;
    }
  }
  ppVar16 = local_80;
  poVar10 = local_88;
  bVar17 = (byte)((mode & 0x20) >> 5) | _Var2 | (byte)((mode & 4) >> 2);
  _Var2 = false;
  if (((mode >> 8 & 1) == 0) && (_Var2 = true, local_88->kind->flavor == (flavor *)0x0)) {
    _Var2 = tval_is_jewelry(local_88);
  }
  _Var3 = false;
  if ((mode & 4) == 0) {
    _Var3 = _Var2;
  }
  _Var2 = _Var3;
  if ((bVar17 == 1 && ppVar16 != (player *)0x0) && (_Var2 = false, (ppVar16->opts).opt[7] != false))
  {
    _Var2 = _Var3;
  }
  if ((poVar10->artifact != (artifact *)0x0) &&
     (((bVar17 != 0 || (_Var3 = object_is_known_artifact(poVar10), _Var3 || (mode & 0x100) != 0)) ||
      (poVar10->kind->flavor == (flavor *)0x0)))) {
    _Var2 = tval_is_wearable(poVar10);
    poVar11 = poVar10;
    if (!_Var2) {
      poVar11 = (object *)&poVar10->kind->base;
    }
    poVar9 = poVar11->kind;
LAB_0018a039:
    pcVar15 = poVar9->name;
    goto LAB_0018a03c;
  }
  switch(poVar10->tval) {
  case '\x01':
  case '\x02':
  case '\x03':
  case '\x04':
  case '\x05':
  case '\x06':
  case '\a':
  case '\b':
  case '\t':
  case '\n':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x1b':
  case '\x1c':
    poVar9 = poVar10->kind;
    goto LAB_0018a039;
  case '\x14':
    pcVar22 = "& # Amulet~";
    pcVar15 = "& Amulet~";
    break;
  case '\x15':
    pcVar22 = "& # Ring~";
    pcVar15 = "& Ring~";
    break;
  case '\x16':
    pcVar22 = "& # Sta|ff|ves|";
    pcVar15 = "& Sta|ff|ves|";
    break;
  case '\x17':
    pcVar22 = "& # Wand~";
    pcVar15 = "& Wand~";
    break;
  case '\x18':
    pcVar22 = "& # Rod~";
    pcVar15 = "& Rod~";
    break;
  case '\x19':
    pcVar22 = "& Scroll~ titled #";
    pcVar15 = "& Scroll~";
    break;
  case '\x1a':
    pcVar22 = "& # Potion~";
    pcVar15 = "& Potion~";
    break;
  case '\x1d':
    pcVar22 = "& # Mushroom~";
    pcVar15 = "& Mushroom~";
    break;
  case '\x1e':
    pcVar22 = "& Book~ #";
    pcVar15 = "& Book~ of Magic Spells #";
    goto LAB_0018a92d;
  case '\x1f':
    pcVar22 = "& Book~ #";
    pcVar15 = "& Holy Book~ of Prayers #";
    goto LAB_0018a92d;
  case ' ':
    pcVar22 = "& Book~ #";
    pcVar15 = "& Book~ of Nature Magics #";
    goto LAB_0018a92d;
  case '!':
    pcVar22 = "& Tome~ #";
    pcVar15 = "& Necromantic Tome~ #";
    goto LAB_0018a92d;
  case '\"':
    pcVar22 = "& Book~ #";
    pcVar15 = "& Book of Mysteries~ #";
LAB_0018a92d:
    bVar5 = (mode & 0x100) == 0;
    goto LAB_0018a935;
  default:
    pcVar15 = "(nothing)";
    goto LAB_0018a03c;
  }
  bVar5 = _Var2 == false;
LAB_0018a935:
  if (!bVar5) {
    pcVar15 = pcVar22;
  }
LAB_0018a03c:
  poVar9 = poVar10->kind;
  _Var2 = tval_can_have_flavor_k(poVar9);
  if (_Var2) {
    poVar9 = (object_kind *)poVar9->flavor;
    if (poVar9 == (object_kind *)0x0) goto LAB_0018a077;
LAB_0018a072:
    pcVar22 = poVar9->name;
  }
  else {
    _Var2 = tval_is_book_k(poVar9);
    if ((_Var2) || (_Var2 = tval_is_jewelry_k(poVar9), _Var2)) goto LAB_0018a072;
LAB_0018a077:
    pcVar22 = "";
  }
  if ((mode & 0x40) != 0) {
    local_78[0] = local_98;
    if ((short)uVar19 == 1) {
      _Var2 = object_is_known_artifact(local_88);
      if (_Var2) {
        pcVar12 = "the ";
        goto LAB_0018a0e4;
      }
      pcVar12 = pcVar15;
      if (*pcVar15 != '&') goto LAB_0018a14e;
      do {
        cVar4 = pcVar12[1];
        pcVar12 = pcVar12 + 1;
      } while (cVar4 == ' ');
      if (cVar4 == '#') {
        if (pcVar22 != (char *)0x0) {
          cVar4 = *pcVar22;
          goto LAB_0018a139;
        }
        bVar5 = true;
      }
      else {
LAB_0018a139:
        _Var2 = is_a_vowel((int)cVar4);
        bVar5 = !_Var2;
      }
      if ((mode >> 8 & 1) == 0) {
        if (bVar5 || bVar24) {
          pcVar12 = "a ";
        }
        else {
          pcVar12 = "an ";
        }
        goto LAB_0018a0e4;
      }
    }
    else if (uVar19 == 0) {
      pcVar12 = "no more ";
LAB_0018a0e4:
      strnfcat(buf,max,local_78,pcVar12);
    }
    else {
      strnfcat(buf,max,local_78,"%u ");
    }
LAB_0018a14e:
    if (bVar24) {
      strnfcat(buf,max,local_78,"well-balanced ");
    }
    local_98 = local_78[0];
  }
  local_98 = obj_desc_name_format(buf,max,local_98,pcVar15,pcVar22,local_90._0_1_);
  poVar10 = local_88;
  _Var2 = object_is_known_artifact(local_88);
  ppVar16 = local_80;
  if (_Var2) {
    strnfcat(buf,max,&local_98," %s",poVar10->artifact->name);
    ppVar16 = local_80;
  }
  else {
    if ((((mode >> 9 & 1) == 0) && (poVar10->known->ego != (ego_item *)0x0)) ||
       (((mode & 4) != 0 && (poVar10->ego != (ego_item *)0x0)))) {
      pcVar15 = poVar10->ego->name;
      pcVar22 = " %s";
    }
    else {
      if (((bVar17 == 0) || (poVar10->artifact != (artifact *)0x0)) ||
         ((poVar9 = poVar10->kind, poVar9->flavor == (flavor *)0x0 && (poVar9->tval != L'\x19'))))
      goto LAB_0018a21e;
      pcVar15 = poVar9->name;
      if ((mode >> 8 & 1) == 0) {
        pcVar22 = " of %s";
      }
      else {
        pcVar22 = " \'%s\'";
      }
    }
    strnfcat(buf,max,&local_98,pcVar22,pcVar15);
  }
LAB_0018a21e:
  sVar8 = local_98;
  if ((mode & 1) == 0) goto LAB_0018a5e8;
  _Var2 = tval_is_chest(poVar10);
  if (_Var2) {
    sVar8 = obj_desc_chest(poVar10,buf,max,sVar8);
  }
  else {
    _Var2 = tval_is_light(poVar10);
    if (_Var2) {
      sVar8 = obj_desc_light(poVar10,buf,max,sVar8);
    }
  }
  p_00 = player;
  poVar11 = poVar10->known;
  local_78[0] = sVar8;
  if ((player->state).shield_on_back == true) {
    wVar6 = slot_by_name(player,"arm");
    poVar10 = slot_object(p_00,wVar6);
    if (poVar10 != poVar11) goto LAB_0018a2a9;
    iVar18 = poVar11->ac / 3;
  }
  else {
LAB_0018a2a9:
    iVar18 = poVar11->ac;
  }
  _Var2 = flag_has_dbg(poVar11->kind->kind_flags,4,0x16,"obj->kind->kind_flags","KF_SHOW_DICE");
  if ((_Var2) &&
     ((ppVar16 == (player *)0x0 || ((ppVar16->obj_k->dd != '\0' && (ppVar16->obj_k->ds != '\0'))))))
  {
    strnfcat(buf,max,local_78," (%dd%d)",(ulong)poVar11->dd,(ulong)poVar11->ds);
  }
  _Var2 = flag_has_dbg(poVar11->kind->kind_flags,4,0x17,"obj->kind->kind_flags","KF_SHOW_MULT");
  if (_Var2) {
    strnfcat(buf,max,local_78," (x%d)",
             (ulong)(uint)((int)poVar11->modifiers[0xc] + (int)poVar11->pval));
  }
  if (((mode & 0x20) == 0) && (poVar10 = local_88, sVar8 = local_78[0], (poVar11->notice & 2) == 0))
  goto LAB_0018a5e8;
  wVar6 = object_to_hit(poVar11);
  wVar7 = object_to_dam(poVar11);
  local_90 = (char *)CONCAT44(local_90._4_4_,wVar7);
  wVar7 = object_to_ac(poVar11);
  if ((ppVar16 == (player *)0x0) || ((ppVar16->obj_k->to_h != 0 && (ppVar16->obj_k->to_d != 0)))) {
    _Var2 = tval_is_weapon(poVar11);
    if ((((int)local_90 == 0 && !_Var2) &&
        ((wVar6 == L'\0' || (_Var2 = tval_is_body_armor(poVar11), _Var2)))) &&
       (((_Var2 = object_has_standard_to_h(poVar11), _Var2 && (wVar6 == poVar11->to_h)) ||
        ((poVar11->artifact != (artifact *)0x0 || (poVar11->ego != (ego_item *)0x0))))))
    goto LAB_0018a411;
    strnfcat(buf,max,local_78," (%+d,%+d)",(ulong)(uint)wVar6,(ulong)local_90 & 0xffffffff);
  }
  else {
LAB_0018a411:
    if ((poVar11->to_h < 0) && (_Var2 = object_has_standard_to_h(poVar11), _Var2)) {
      uVar23 = (ulong)(uint)(int)poVar11->to_h;
    }
    else if (((int)local_90 == 0) || ((ppVar16 != (player *)0x0 && (ppVar16->obj_k->to_d == 0)))) {
      if ((wVar6 == L'\0') || ((ppVar16 != (player *)0x0 && (ppVar16->obj_k->to_h == 0))))
      goto LAB_0018a531;
      uVar23 = (ulong)(uint)wVar6;
    }
    else {
      uVar23 = (ulong)local_90 & 0xffffffff;
    }
    strnfcat(buf,max,local_78," (%+d)",uVar23);
  }
LAB_0018a531:
  wVar6 = (wchar_t)iVar18;
  if (ppVar16 == (player *)0x0) {
LAB_0018a551:
    if ((poVar11->ac != 0) || (_Var2 = tval_is_armor(poVar11), _Var2)) {
      strnfcat(buf,max,local_78," [%d,%+d]",(ulong)(uint)wVar6,(ulong)(uint)wVar7);
      poVar10 = local_88;
      sVar8 = local_78[0];
      goto LAB_0018a5e8;
    }
LAB_0018a588:
    poVar10 = local_88;
    sVar8 = local_78[0];
    if (poVar11->to_a == 0) goto LAB_0018a5e8;
    pcVar15 = " [%+d]";
    wVar6 = wVar7;
  }
  else {
    sVar1 = ppVar16->obj_k->ac;
    if (ppVar16->obj_k->to_a != 0) {
      if (sVar1 != 0) goto LAB_0018a551;
      goto LAB_0018a588;
    }
    poVar10 = local_88;
    sVar8 = local_78[0];
    if ((sVar1 == 0) ||
       ((poVar11->ac == 0 &&
        (_Var2 = tval_is_armor(poVar11), poVar10 = local_88, sVar8 = local_78[0], !_Var2))))
    goto LAB_0018a5e8;
    pcVar15 = " [%d]";
  }
  strnfcat(buf,max,local_78,pcVar15,(ulong)(uint)wVar6);
  poVar10 = local_88;
  sVar8 = local_78[0];
LAB_0018a5e8:
  if ((mode & 2) != 0) {
    poVar11 = poVar10->known;
    local_78[6] = 0;
    local_78[7] = 0;
    local_78[4] = 0;
    local_78[5] = 0;
    local_78[2] = 0;
    local_78[3] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_38 = 0;
    lVar13 = 0;
    uVar19 = 0;
    do {
      sVar1 = poVar11->modifiers[lVar13];
      uVar14 = (uint)sVar1;
      if (sVar1 != 0) {
        if (uVar19 == 0) {
          local_78[0] = (size_t)uVar14;
          uVar19 = 1;
        }
        else {
          if ((int)uVar19 < 1) {
            uVar23 = 0;
          }
          else {
            uVar20 = 0;
            do {
              uVar23 = uVar20;
              if (*(uint *)((long)local_78 + uVar20 * 4) == uVar14) break;
              uVar20 = uVar20 + 1;
              uVar23 = (ulong)uVar19;
            } while (uVar19 != uVar20);
          }
          if ((uint)uVar23 == uVar19) {
            lVar21 = (long)(int)uVar19;
            uVar19 = uVar19 + 1;
            *(uint *)((long)local_78 + lVar21 * 4) = uVar14;
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x11);
    local_98 = sVar8;
    if (uVar19 != 0) {
      local_90 = buf;
      strnfcat(buf,max,&local_98," <");
      pcVar15 = local_90;
      if (0 < (int)uVar19) {
        uVar23 = 0;
        do {
          if (uVar23 != 0) {
            strnfcat(pcVar15,max,&local_98,", ");
          }
          strnfcat(pcVar15,max,&local_98,"%+d",(ulong)*(uint *)((long)local_78 + uVar23 * 4));
          uVar23 = uVar23 + 1;
        } while (uVar19 != uVar23);
      }
      buf = local_90;
      strnfcat(local_90,max,&local_98,">");
      ppVar16 = local_80;
      poVar10 = local_88;
    }
    local_78[0] = local_98;
    _Var2 = object_flavor_is_aware(poVar10);
    if (((mode & 4) == 0 && !_Var2) || (_Var2 = tval_can_have_charges(poVar10), !_Var2)) {
      if (0 < poVar10->timeout) {
        _Var2 = tval_is_rod(poVar10);
        if ((_Var2) && (1 < poVar10->number)) {
          wVar6 = number_charging(poVar10);
          strnfcat(buf,max,local_78," (%d charging)",(ulong)(uint)wVar6);
        }
        else {
          _Var2 = tval_is_rod(poVar10);
          if ((_Var2) ||
             ((poVar10->activation != (activation *)0x0 || (poVar10->effect != (effect *)0x0)))) {
            strnfcat(buf,max,local_78," (charging)");
          }
        }
      }
    }
    else {
      pcVar15 = "s";
      if ((int)poVar10->pval == 1) {
        pcVar15 = "";
      }
      strnfcat(buf,max,local_78," (%d charge%s)",(ulong)(uint)(int)poVar10->pval,pcVar15);
    }
    if ((mode & 4) == 0) {
      sVar8 = obj_desc_inscrip(poVar10,buf,max,local_78[0],ppVar16);
    }
    else {
      sVar8 = obj_desc_aware(poVar10,buf,max,local_78[0]);
    }
  }
  return sVar8;
}

Assistant:

size_t object_desc(char *buf, size_t max, const struct object *obj,
		uint32_t mode, const struct player *p)
{
	bool prefix = mode & ODESC_PREFIX ? true : false;
	bool spoil = mode & ODESC_SPOIL ? true : false;
	bool terse = mode & ODESC_TERSE ? true : false;

	size_t end = 0;

	/* Simple description for null item */
	if (!obj || !obj->known)
		return strnfmt(buf, max, "(nothing)");

	/* Unknown itema and cash get straightforward descriptions */
	if (obj->known && obj->kind != obj->known->kind) {
		if (prefix)
			return strnfmt(buf, max, "an unknown item");
		return strnfmt(buf, max, "unknown item");
	}

	if (tval_is_money(obj))
		return strnfmt(buf, max, "%d gold pieces worth of %s%s",
				obj->pval, obj->kind->name,
				ignore_item_ok(p, obj) ? " {ignore}" : "");

	/* Egos and kinds whose name we know are seen */
	if (obj->known->ego && !spoil)
		obj->ego->everseen = true;

	if (object_flavor_is_aware(obj) && !spoil)
		obj->kind->everseen = true;

	/** Construct the name **/

	/* Copy the base name to the buffer */
	end = obj_desc_name(buf, max, end, obj, prefix, mode, terse, p);

	/* Combat properties */
	if (mode & ODESC_COMBAT) {
		if (tval_is_chest(obj))
			end = obj_desc_chest(obj, buf, max, end);
		else if (tval_is_light(obj))
			end = obj_desc_light(obj, buf, max, end);

		end = obj_desc_combat(obj->known, buf, max, end, mode, p);
	}

	/* Modifiers, charges, flavour details, inscriptions */
	if (mode & ODESC_EXTRA) {
		end = obj_desc_mods(obj->known, buf, max, end);

		end = obj_desc_charges(obj, buf, max, end, mode);

		if (mode & ODESC_STORE)
			end = obj_desc_aware(obj, buf, max, end);
		else
			end = obj_desc_inscrip(obj, buf, max, end, p);
	}

	return end;
}